

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool tree_sitter_haskell_external_scanner_scan(void *payload,TSLexer *lexer,_Bool *valid_symbols)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  ContextSort CVar3;
  TSLexer *pTVar4;
  State *pSVar5;
  Lexed LVar6;
  _Bool _Var7;
  _Bool _Var8;
  undefined1 uVar9;
  byte bVar10;
  bool bVar11;
  uint uVar12;
  Symbol SVar13;
  Lexed next;
  uint32_t uVar14;
  uint32_t uVar15;
  int32_t iVar16;
  CtrResult CVar17;
  StartLayout start;
  int iVar18;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  uint32_t end;
  bool bVar22;
  ulong uStack_90;
  int local_80;
  Env env;
  Newline local_48;
  
  env.symop = 0;
  if (*valid_symbols != false) {
    return false;
  }
  env.lexer = lexer;
  env.symbols = valid_symbols;
  env.state = (State *)payload;
  (*lexer->mark_end)(lexer);
  if (valid_symbols[0xd] == true) {
    push_context(&env,TExp,0);
    uStack_90 = 0xd;
    goto LAB_001080b9;
  }
  if (((valid_symbols[0xe] == true) && (*(int *)((long)payload + 8) != 0)) &&
     (uVar12 = *(int *)((long)payload + 8) - 1, *(int *)(*payload + (ulong)uVar12 * 8) == 7)) {
    *(uint *)((long)payload + 8) = uVar12;
    uStack_90 = 0xe;
    goto LAB_001080b9;
  }
  if (valid_symbols[0xb] == true) {
    push_context(&env,Braces,0);
    uStack_90 = 0xb;
    goto LAB_001080b9;
  }
  if (((valid_symbols[0xc] == true) && (*(int *)((long)payload + 8) != 0)) &&
     (uVar12 = *(int *)((long)payload + 8) - 1, *(int *)(*payload + (ulong)uVar12 * 8) == 6)) {
    *(uint *)((long)payload + 8) = uVar12;
    uStack_90 = 0xc;
    goto LAB_001080b9;
  }
  if (valid_symbols[0x19] == true) {
    uStack_90 = 0x19;
    do {
      while( true ) {
        _Var7 = (*lexer->eof)(lexer);
        if (_Var7) goto LAB_001080b9;
        if (lexer->lookahead == 0x7c) break;
        if (lexer->lookahead == 0x27e7) {
          (*lexer->mark_end)(lexer);
          goto LAB_001080b9;
        }
        advance(&env);
      }
      (*lexer->mark_end)(lexer);
      advance(&env);
    } while (lexer->lookahead != 0x5d);
    goto LAB_001080b9;
  }
  uVar12 = *(int *)((long)payload + 0x10) - 1;
  pcVar19 = (char *)(ulong)uVar12;
  if (uVar12 < 2) {
    SVar13 = newline_post(&env);
LAB_00108187:
    if (SVar13 == FAIL) goto LAB_0010818b;
  }
  else {
    if (*(int *)((long)payload + 0x10) == 3) {
      uVar2 = *(undefined4 *)((long)payload + 0x18);
      skip_space(&env);
      *(undefined8 *)((long)payload + 0x10) = 0;
      *(undefined8 *)((long)payload + 0x18) = 0;
      *(undefined4 *)((long)payload + 0x18) = uVar2;
      SVar13 = newline_start(&env);
      goto LAB_00108187;
    }
LAB_0010818b:
    _Var7 = skip_space(&env);
    if (((uint)(env.lexer)->lookahead < 0xe) &&
       (pcVar19 = (char *)0x3400, (0x3400U >> ((env.lexer)->lookahead & 0x1fU) & 1) != 0)) {
      SVar13 = newline_start(&env);
      if (SVar13 == FAIL) {
LAB_001081d6:
        pTVar4 = env.lexer;
        _Var7 = (*(env.lexer)->eof)(env.lexer);
        pSVar5 = env.state;
        if ((!_Var7) || (((env.state)->lookahead).size != 0)) {
          return false;
        }
        (*pTVar4->mark_end)(pTVar4);
        if (env.symbols[9] == true) {
          uVar15 = (pSVar5->contexts).size;
          uStack_90 = 9;
          if (uVar15 != 0) {
            (pSVar5->contexts).size = uVar15 - 1;
          }
        }
        else {
          if (env.symbols[1] == false) {
            uVar20 = (ulong)(pSVar5->contexts).size;
            uVar21 = uVar20;
            do {
              uVar21 = uVar21 - 1;
              if ((int)uVar21 + 1 < 1) {
                return false;
              }
              iVar18 = (int)uVar20;
              if (uVar20 <= uVar21) {
                __assert_fail("(uint32_t)(i) < (&env->state->contexts)->size",
                              "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-haskell/src/scanner.c"
                              ,0x7e8,"Symbol force_end_context(Env *)");
              }
              CVar3 = (pSVar5->contexts).contents[uVar21].sort;
              uStack_90 = 0xe;
              if (CVar3 == TExp) {
LAB_00108398:
                (pSVar5->contexts).size = iVar18 - 1;
                if (env.symbols[uStack_90] != false) goto LAB_001080b9;
              }
              else {
                if (CVar3 == Braces) {
                  uStack_90 = 0xc;
                  goto LAB_00108398;
                }
                uStack_90 = 9;
                if (CVar3 < Braces) goto LAB_00108398;
                (pSVar5->contexts).size = iVar18 - 1;
              }
              uVar20 = (ulong)(iVar18 - 1);
            } while( true );
          }
          uStack_90 = 1;
        }
        goto LAB_001080b9;
      }
    }
    else {
      _Var8 = (*(env.lexer)->eof)(env.lexer);
      if (_Var8) goto LAB_001081d6;
      uVar15 = 0;
      next = lex(&env,false);
      pSVar5 = env.state;
      if (((env.state)->newline).skip_semi == true) {
        if (next - LPragma < 3) {
LAB_001082da:
          SVar13 = process_token_safe(&env,next);
          if (SVar13 != FAIL) goto LAB_001081bd;
          start = valid_layout_start(&env,next);
          pTVar4 = env.lexer;
          if (start.sort != NoContext) {
            _Var8 = (*(env.lexer)->eof)(env.lexer);
            uVar15 = 0;
            if (!_Var8) {
              uVar15 = (*pTVar4->get_column)(pTVar4);
            }
            SVar13 = start_layout(&env,start,uVar15 - ((env.state)->lookahead).size,pcVar19);
            goto LAB_001083e1;
          }
        }
        else if (next != LSemi) {
          ((env.state)->newline).skip_semi = false;
LAB_001083c9:
          uStack_90 = 0x30;
          goto LAB_001080b9;
        }
      }
      else if (next != LModule) {
        if (next == LSemi) {
          if (env.symbols[1] == true) {
            ((env.state)->newline).skip_semi = true;
            goto LAB_001083c9;
          }
        }
        else {
          if (next == LBracketOpen) {
            uStack_90 = 0x18;
            goto LAB_001080b9;
          }
          if (next != LBraceClose) goto LAB_001082da;
          if (((env.symbols[10] == true) && (uVar14 = ((env.state)->contexts).size, uVar14 != 0)) &&
             (((env.state)->contexts).contents[uVar14 - 1].sort == Braces)) {
            advance_over(&env,uVar15);
            (*(env.lexer)->mark_end)(env.lexer);
            uVar15 = (pSVar5->contexts).size;
            uStack_90 = 10;
            if (uVar15 != 0) {
              (pSVar5->contexts).size = uVar15 - 1;
            }
            goto LAB_001080b9;
          }
          SVar13 = token_end_layout_texp(&env);
LAB_001083e1:
          uStack_90 = (ulong)SVar13;
          if (SVar13 != FAIL) goto LAB_001080b9;
        }
      }
      SVar13 = process_token_symop(&env,_Var7,next);
      if (SVar13 == FAIL) {
        if (((env.symbols[0x2a] != false) || (env.symbols[0x2b] != false)) ||
           ((env.symbols[0x2c] != false || (env.symbols[0x2d] == true)))) {
          local_80 = 0;
          bVar11 = false;
          bVar10 = 0;
LAB_00108459:
          if (((bVar10 & 1) != 0) || (_Var7 = (*(env.lexer)->eof)(env.lexer), _Var7))
          goto LAB_001087d9;
          local_48.state = NInactive;
          local_48.end = LNothing;
          local_48.indent = 99999;
          local_48.eof = false;
          local_48.no_semi = false;
          local_48.skip_semi = false;
          local_48.unsafe = false;
          newline_lookahead(&env,&local_48);
          uVar15 = local_48.indent;
          uVar14 = current_indent(&env);
          if ((uVar15 <= uVar14) &&
             ((uVar15 = ((env.state)->contexts).size, uVar15 == 0 ||
              (((env.state)->contexts).contents[uVar15 - 1].sort != Braces)))) goto LAB_001087d9;
          LVar6 = local_48.end;
          if (local_48.end - LTexpCloser < 9) {
            uVar9 = (*(code *)(&DAT_00494550 +
                              *(int *)(&DAT_00494550 + (ulong)(local_48.end - LTexpCloser) * 4)))();
            return (_Bool)uVar9;
          }
          if (local_48.end - LSymop < 2) {
            uVar15 = symop_lookahead(&env);
            goto LAB_0010859d;
          }
          if (local_48.end != LNothing) {
            if (local_48.end == LUpper) {
              uVar15 = conid(&env);
            }
            else {
              uVar15 = 1;
              if (local_48.end != LDotId) goto LAB_0010859d;
            }
            goto LAB_001087aa;
          }
          iVar16 = peek0(&env);
          pTVar4 = env.lexer;
          switch(iVar16) {
          case 0x22:
            uVar15 = 1;
            do {
              uVar14 = advance_until_char(&env,uVar15,0x22);
              uVar15 = uVar14 + 1;
              _Var7 = (*pTVar4->eof)(pTVar4);
              if (_Var7) break;
              bVar22 = false;
              while ((uVar14 = uVar14 - 1, -1 < (int)uVar14 &&
                     (iVar16 = peek(&env,uVar14), iVar16 == 0x5c))) {
                bVar22 = (bool)(bVar22 ^ 1);
              }
            } while (bVar22);
            break;
          case 0x23:
          case 0x24:
          case 0x25:
          case 0x26:
            goto switchD_0010852b_caseD_23;
          case 0x27:
            _Var7 = char1(&env,0x5c);
            if (_Var7) {
              uVar15 = advance_until_char(&env,2,0x27);
              uVar15 = uVar15 + 2;
            }
            else {
              iVar16 = peek(&env,2);
              uVar15 = (uint)(iVar16 == 0x27) * 2 + 1;
            }
            break;
          case 0x28:
switchD_0010852b_caseD_28:
            local_80 = local_80 + 1;
            uVar15 = 1;
            break;
          case 0x29:
switchD_0010852b_caseD_29:
            uVar15 = 1;
            if (local_80 != 0) {
              local_80 = local_80 + -1;
              break;
            }
            goto LAB_0010879c;
          default:
            if (iVar16 == 0x5b) goto switchD_0010852b_caseD_28;
            if (iVar16 == 0x5d) goto switchD_0010852b_caseD_29;
            goto switchD_0010852b_caseD_23;
          }
LAB_001087aa:
          puVar1 = &((env.state)->lookahead).offset;
          *puVar1 = *puVar1 + uVar15;
          env.symop = 0;
          goto LAB_00108459;
        }
        goto LAB_0010883c;
      }
    }
  }
LAB_001081bd:
  uStack_90 = (ulong)SVar13;
LAB_001080b9:
  (env.lexer)->result_symbol = (TSSymbol)uStack_90;
  return true;
LAB_001087d9:
  if ((bVar11) && (env.symbols[0x2d] != false)) {
    uStack_90 = 0x2d;
    goto LAB_001080b9;
  }
LAB_0010883c:
  if ((next == LDollar) && (env.symbols[0x1a] != false)) {
    uStack_90 = 0x1a;
    goto LAB_001080b9;
  }
  goto LAB_001081d6;
switchD_0010852b_caseD_23:
  iVar16 = peek0(&env);
  _Var7 = varid_start_char(iVar16);
  uVar15 = 1;
  if (_Var7) {
    uVar15 = advance_while(&env,1,is_id_char);
  }
LAB_0010859d:
  if (local_80 == 0) {
    local_80 = 0;
    uVar12 = LVar6 - LWhere;
    if (uVar12 < 0x18) {
      uVar9 = (*(code *)(&DAT_00494594 + *(int *)(&DAT_00494594 + (ulong)uVar12 * 4)))();
      return (_Bool)uVar9;
    }
    if ((LVar6 == LSemi) || (iVar16 = peek0(&env), iVar16 == 0x2200)) {
LAB_0010879c:
      bVar10 = 1;
LAB_001087a2:
      local_80 = 0;
    }
    else if (iVar16 == 0x3d) {
      bVar10 = env.symbols[0x2d] ^ 1;
      bVar11 = true;
    }
    else {
      if (iVar16 == 0x66) {
        CVar17 = ctr_stop_on_token(&env,"forall");
        pcVar19 = "data_family";
        if (CVar17 != CtrUndecided) goto LAB_0010879c;
      }
      else {
        pcVar19 = "data_instance";
        if (iVar16 != 0x69) {
          if (iVar16 != 0x3a) goto LAB_001087aa;
          _Var7 = char1(&env,0x3a);
          if (_Var7) goto LAB_0010879c;
          goto LAB_001087a2;
        }
      }
      CVar17 = ctr_stop_on_token(&env,pcVar19 + 5);
      if (CVar17 != CtrUndecided) {
        bVar10 = 1;
      }
    }
  }
  goto LAB_001087aa;
}

Assistant:

static bool scan(Env *env) {
  if(after_error(env)) { dbg("error recovery\n"); return false; }
#ifdef TREE_SITTER_DEBUG
  Symbol result = scan_debug(env);
#else
  Symbol result = scan_main(env);
#endif
  return process_result(env, result);
}